

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O3

FileName * __thiscall
embree::FileName::setExt(FileName *__return_storage_ptr__,FileName *this,string *ext)

{
  long lVar1;
  ulong uVar2;
  long *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  char local_40 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  lVar1 = std::__cxx11::string::rfind((char)this,0x2f);
  uVar2 = std::__cxx11::string::rfind((char)this,0x2e);
  if ((uVar2 == 0xffffffffffffffff) || (uVar2 < lVar1 + 1U)) {
    std::operator+(&local_60,&this->filename,ext);
    FileName(__return_storage_ptr__,&local_60);
    paVar4 = &local_60.field_2;
  }
  else {
    std::__cxx11::string::substr((ulong)local_40,(ulong)this);
    plVar3 = (long *)std::__cxx11::string::_M_append(local_40,(ulong)(ext->_M_dataplus)._M_p);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_60.field_2._M_allocated_capacity = *psVar5;
      local_60.field_2._8_8_ = plVar3[3];
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    }
    else {
      local_60.field_2._M_allocated_capacity = *psVar5;
      local_60._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_60._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    FileName(__return_storage_ptr__,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    paVar4 = &local_30;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar4->_M_allocated_capacity)[-2] != paVar4) {
    operator_delete((undefined1 *)(&paVar4->_M_allocated_capacity)[-2]);
  }
  return __return_storage_ptr__;
}

Assistant:

FileName FileName::setExt(const std::string& ext) const {
    size_t start = filename.find_last_of(path_sep);
    if (start == std::string::npos) start = 0; else start++;
    size_t end = filename.find_last_of('.');
    if (end == std::string::npos || end < start) return FileName(filename+ext);
    return FileName(filename.substr(0,end)+ext);
  }